

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

int Scl_LibertyReadTable
              (Scl_Tree_t *p,Vec_Str_t *vOut,Scl_Item_t *pTiming,char *pName,Vec_Ptr_t *vTemples)

{
  void **ppvVar1;
  Vec_Flt_t *pVVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  Scl_Item_t *pSVar11;
  Vec_Flt_t *pVVar12;
  Vec_Flt_t *pVVar13;
  Vec_Flt_t *local_60;
  Vec_Flt_t *local_58;
  Vec_Flt_t *local_50;
  
  uVar6 = pTiming->Child;
  iVar8 = p->nItems;
  if ((int)uVar6 < iVar8) {
    if ((int)uVar6 < 0) {
      pSVar11 = (Scl_Item_t *)0x0;
    }
    else {
      pSVar11 = p->pItems + uVar6;
    }
    if (pSVar11 == (Scl_Item_t *)0x0) {
      return 0;
    }
    pcVar5 = p->pContents;
    while( true ) {
      iVar3 = (pSVar11->Key).Beg;
      iVar7 = (pSVar11->Key).End - iVar3;
      iVar3 = strncmp(pcVar5 + iVar3,pName,(long)iVar7);
      if ((iVar3 == 0) && (sVar4 = strlen(pName), iVar7 == (int)sVar4)) break;
      uVar6 = pSVar11->Next;
      if (iVar8 <= (int)uVar6) goto LAB_0046754f;
      if ((int)uVar6 < 0) {
        pSVar11 = (Scl_Item_t *)0x0;
      }
      else {
        pSVar11 = p->pItems + uVar6;
      }
      if (pSVar11 == (Scl_Item_t *)0x0) {
        return 0;
      }
    }
    pcVar5 = Scl_LibertyReadString(p,pSVar11->Head);
    if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
      uVar6 = pSVar11->Child;
      if ((int)uVar6 < p->nItems) {
        if ((int)uVar6 < 0) {
          pSVar11 = (Scl_Item_t *)0x0;
        }
        else {
          pSVar11 = p->pItems + uVar6;
        }
        if (pSVar11 == (Scl_Item_t *)0x0) {
          local_50 = (Vec_Flt_t *)0x0;
          local_60 = (Vec_Flt_t *)0x0;
          local_58 = (Vec_Flt_t *)0x0;
        }
        else {
          local_58 = (Vec_Flt_t *)0x0;
          local_60 = (Vec_Flt_t *)0x0;
          local_50 = (Vec_Flt_t *)0x0;
          do {
            iVar3 = (pSVar11->Key).Beg;
            pcVar5 = p->pContents + iVar3;
            iVar3 = (pSVar11->Key).End - iVar3;
            sVar4 = (size_t)iVar3;
            iVar8 = strncmp(pcVar5,"index_1",sVar4);
            if (iVar3 == 7 && iVar8 == 0) {
              if (local_50 != (Vec_Flt_t *)0x0) {
                __assert_fail("vIndex1 == NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                              ,0x4d1,
                              "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              pcVar5 = Scl_LibertyReadString(p,pSVar11->Head);
              local_50 = Scl_LibertyReadFloatVec(pcVar5);
            }
            else {
              iVar8 = strncmp(pcVar5,"index_2",sVar4);
              if ((iVar8 == 0) && (iVar3 == 7)) {
                if (local_60 != (Vec_Flt_t *)0x0) {
                  __assert_fail("vIndex2 == NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                                ,0x4d3,
                                "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                               );
                }
                pcVar5 = Scl_LibertyReadString(p,pSVar11->Head);
                local_60 = Scl_LibertyReadFloatVec(pcVar5);
              }
              else {
                iVar8 = strncmp(pcVar5,"values",sVar4);
                if ((iVar8 == 0) && (iVar3 == 6)) {
                  if (local_58 != (Vec_Flt_t *)0x0) {
                    __assert_fail("vValues == NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                                  ,0x4d5,
                                  "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                                 );
                  }
                  pcVar5 = Scl_LibertyReadString(p,pSVar11->Head);
                  local_58 = Scl_LibertyReadFloatVec(pcVar5);
                }
              }
            }
            uVar6 = pSVar11->Next;
            if (p->nItems <= (int)uVar6) goto LAB_0046754f;
            if ((int)uVar6 < 0) {
              pSVar11 = (Scl_Item_t *)0x0;
            }
            else {
              pSVar11 = p->pItems + uVar6;
            }
          } while (pSVar11 != (Scl_Item_t *)0x0);
        }
        if (((local_50 != (Vec_Flt_t *)0x0) && (local_60 != (Vec_Flt_t *)0x0)) &&
           (local_58 != (Vec_Flt_t *)0x0)) {
          Vec_StrPutI_(vOut,local_50->nSize);
          if (0 < local_50->nSize) {
            lVar9 = 0;
            do {
              Vec_StrPutF_(vOut,local_50->pArray[lVar9]);
              lVar9 = lVar9 + 1;
            } while (lVar9 < local_50->nSize);
          }
          Vec_StrPutI_(vOut,local_60->nSize);
          iVar8 = local_60->nSize;
          if (0 < iVar8) {
            lVar9 = 0;
            do {
              Vec_StrPutF_(vOut,local_60->pArray[lVar9]);
              lVar9 = lVar9 + 1;
              iVar8 = local_60->nSize;
            } while (lVar9 < iVar8);
          }
          if (iVar8 * local_50->nSize != local_58->nSize) {
            __assert_fail("Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                          ,0x4e8,
                          "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                         );
          }
          if (0 < local_58->nSize) {
            lVar9 = 0;
            do {
              Vec_StrPutF_(vOut,local_58->pArray[lVar9]);
              lVar9 = lVar9 + 1;
            } while (lVar9 < local_58->nSize);
          }
LAB_00467494:
          iVar8 = 3;
          do {
            Vec_StrPutF_(vOut,0.0);
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
          iVar8 = 4;
          do {
            Vec_StrPutF_(vOut,0.0);
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
          iVar8 = 6;
          do {
            Vec_StrPutF_(vOut,0.0);
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
          if (local_50 != (Vec_Flt_t *)0x0) {
            if (local_50->pArray != (float *)0x0) {
              free(local_50->pArray);
              local_50->pArray = (float *)0x0;
            }
            free(local_50);
          }
          if (local_60 != (Vec_Flt_t *)0x0) {
            if (local_60->pArray != (float *)0x0) {
              free(local_60->pArray);
              local_60->pArray = (float *)0x0;
            }
            free(local_60);
          }
          if (local_58 != (Vec_Flt_t *)0x0) {
            if (local_58->pArray != (float *)0x0) {
              free(local_58->pArray);
              local_58->pArray = (float *)0x0;
            }
            free(local_58);
            return 1;
          }
          return 1;
        }
        pcVar5 = "Incomplete table specification";
LAB_004670f5:
        puts(pcVar5);
        return 0;
      }
    }
    else {
      iVar8 = vTemples->nSize;
      if (0 < (long)iVar8) {
        uVar10 = 0;
        do {
          if (((uVar10 & 3) == 0) &&
             (iVar3 = strcmp(pcVar5,(char *)vTemples->pArray[uVar10]), iVar3 == 0))
          goto LAB_00466e7e;
          uVar10 = uVar10 + 1;
        } while ((long)iVar8 != uVar10);
      }
      uVar10 = 0xffffffff;
LAB_00466e7e:
      iVar8 = (int)uVar10;
      if (iVar8 == -1) {
        pcVar5 = "Template cannot be found in the template library";
        goto LAB_004670f5;
      }
      uVar6 = pSVar11->Child;
      if ((int)uVar6 < p->nItems) {
        if ((int)uVar6 < 0) {
          pSVar11 = (Scl_Item_t *)0x0;
        }
        else {
          pSVar11 = p->pItems + uVar6;
        }
        if (pSVar11 == (Scl_Item_t *)0x0) {
          local_50 = (Vec_Flt_t *)0x0;
          local_60 = (Vec_Flt_t *)0x0;
          local_58 = (Vec_Flt_t *)0x0;
        }
        else {
          local_58 = (Vec_Flt_t *)0x0;
          local_60 = (Vec_Flt_t *)0x0;
          local_50 = (Vec_Flt_t *)0x0;
          do {
            iVar7 = (pSVar11->Key).Beg;
            pcVar5 = p->pContents + iVar7;
            iVar7 = (pSVar11->Key).End - iVar7;
            sVar4 = (size_t)iVar7;
            iVar3 = strncmp(pcVar5,"index_1",sVar4);
            if (iVar7 == 7 && iVar3 == 0) {
              if (local_50 != (Vec_Flt_t *)0x0) {
                __assert_fail("vIndex1 == NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                              ,0x500,
                              "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              pcVar5 = Scl_LibertyReadString(p,pSVar11->Head);
              local_50 = Scl_LibertyReadFloatVec(pcVar5);
            }
            else {
              iVar3 = strncmp(pcVar5,"index_2",sVar4);
              if ((iVar3 == 0) && (iVar7 == 7)) {
                if (local_60 != (Vec_Flt_t *)0x0) {
                  __assert_fail("vIndex2 == NULL",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                                ,0x502,
                                "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                               );
                }
                pcVar5 = Scl_LibertyReadString(p,pSVar11->Head);
                local_60 = Scl_LibertyReadFloatVec(pcVar5);
              }
              else {
                iVar3 = strncmp(pcVar5,"values",sVar4);
                if ((iVar3 == 0) && (iVar7 == 6)) {
                  if (local_58 != (Vec_Flt_t *)0x0) {
                    __assert_fail("vValues == NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                                  ,0x504,
                                  "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                                 );
                  }
                  pcVar5 = Scl_LibertyReadString(p,pSVar11->Head);
                  local_58 = Scl_LibertyReadFloatVec(pcVar5);
                }
              }
            }
            uVar6 = pSVar11->Next;
            if (p->nItems <= (int)uVar6) goto LAB_0046754f;
            if ((int)uVar6 < 0) {
              pSVar11 = (Scl_Item_t *)0x0;
            }
            else {
              pSVar11 = p->pItems + uVar6;
            }
          } while (pSVar11 != (Scl_Item_t *)0x0);
        }
        if (-3 < iVar8) {
          if (((int)(iVar8 + 2U) < vTemples->nSize) && ((int)(iVar8 + 3U) < vTemples->nSize)) {
            ppvVar1 = vTemples->pArray;
            pVVar13 = (Vec_Flt_t *)ppvVar1[iVar8 + 2U];
            pVVar2 = (Vec_Flt_t *)ppvVar1[iVar8 + 3U];
            if (ppvVar1[(long)iVar8 + 1] == (void *)0x0) {
              if ((local_50 != (Vec_Flt_t *)0x0) && (local_50->nSize != pVVar13->nSize)) {
                __assert_fail("!vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                              ,0x50b,
                              "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              pVVar12 = pVVar2;
              if ((local_60 != (Vec_Flt_t *)0x0) &&
                 (pVVar12 = local_60, local_60->nSize != pVVar2->nSize)) {
                __assert_fail("!vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd2)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                              ,0x50c,
                              "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              if (local_50 != (Vec_Flt_t *)0x0) {
                pVVar13 = local_50;
              }
              Vec_StrPutI_(vOut,pVVar13->nSize);
              if (0 < pVVar13->nSize) {
                lVar9 = 0;
                do {
                  Vec_StrPutF_(vOut,pVVar13->pArray[lVar9]);
                  lVar9 = lVar9 + 1;
                } while (lVar9 < pVVar13->nSize);
              }
              Vec_StrPutI_(vOut,pVVar12->nSize);
              iVar8 = pVVar12->nSize;
              if (0 < iVar8) {
                lVar9 = 0;
                do {
                  Vec_StrPutF_(vOut,pVVar12->pArray[lVar9]);
                  lVar9 = lVar9 + 1;
                  iVar8 = pVVar12->nSize;
                } while (lVar9 < iVar8);
              }
              if (iVar8 * pVVar13->nSize != local_58->nSize) {
                __assert_fail("Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                              ,0x51b,
                              "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              if (0 < local_58->nSize) {
                lVar9 = 0;
                do {
                  Vec_StrPutF_(vOut,local_58->pArray[lVar9]);
                  lVar9 = lVar9 + 1;
                } while (lVar9 < local_58->nSize);
              }
            }
            else {
              if ((local_60 != (Vec_Flt_t *)0x0) && (local_60->nSize != pVVar13->nSize)) {
                __assert_fail("!vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                              ,0x525,
                              "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              pVVar12 = pVVar2;
              if ((local_50 != (Vec_Flt_t *)0x0) &&
                 (pVVar12 = local_50, local_50->nSize != pVVar2->nSize)) {
                __assert_fail("!vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd2)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                              ,0x526,
                              "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              if (local_60 != (Vec_Flt_t *)0x0) {
                pVVar13 = local_60;
              }
              Vec_StrPutI_(vOut,pVVar13->nSize);
              if (0 < pVVar13->nSize) {
                lVar9 = 0;
                do {
                  Vec_StrPutF_(vOut,pVVar13->pArray[lVar9]);
                  lVar9 = lVar9 + 1;
                } while (lVar9 < pVVar13->nSize);
              }
              Vec_StrPutI_(vOut,pVVar12->nSize);
              iVar8 = pVVar12->nSize;
              if (0 < iVar8) {
                lVar9 = 0;
                do {
                  Vec_StrPutF_(vOut,pVVar12->pArray[lVar9]);
                  lVar9 = lVar9 + 1;
                  iVar8 = pVVar12->nSize;
                } while (lVar9 < iVar8);
              }
              if (iVar8 * pVVar13->nSize != local_58->nSize) {
                __assert_fail("Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                              ,0x535,
                              "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              iVar8 = local_58->nSize;
              if (0 < iVar8) {
                iVar3 = 0;
                do {
                  uVar6 = (iVar3 % pVVar12->nSize) * pVVar13->nSize + iVar3 / pVVar12->nSize;
                  if (((int)uVar6 < 0) || (iVar8 <= (int)uVar6)) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                                  ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
                  }
                  Vec_StrPutF_(vOut,local_58->pArray[uVar6]);
                  iVar3 = iVar3 + 1;
                  iVar8 = local_58->nSize;
                } while (iVar3 < iVar8);
              }
            }
            goto LAB_00467494;
          }
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
    }
  }
LAB_0046754f:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                ,0x4d,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

int Scl_LibertyReadTable( Scl_Tree_t * p, Vec_Str_t * vOut, Scl_Item_t * pTiming, char * pName, Vec_Ptr_t * vTemples )
{
    Vec_Flt_t * vIndex1 = NULL;
    Vec_Flt_t * vIndex2 = NULL;
    Vec_Flt_t * vValues = NULL;
    Vec_Flt_t * vInd1, * vInd2;
    Scl_Item_t * pItem, * pTable = NULL;
    char * pThis, * pTempl = NULL;
    int iPlace, i;
    float Entry;
    // find the table
    Scl_ItemForEachChildName( p, pTiming, pTable, pName )
        break;
    if ( pTable == NULL )
        return 0;
    // find the template
    pTempl = Scl_LibertyReadString(p, pTable->Head);
    if ( pTempl == NULL || pTempl[0] == 0 )
    {
        // read the numbers
        Scl_ItemForEachChild( p, pTable, pItem )
        {
            if ( !Scl_LibertyCompare(p, pItem->Key, "index_1") )
                assert(vIndex1 == NULL), vIndex1 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "index_2") )
                assert(vIndex2 == NULL), vIndex2 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "values") )
                assert(vValues == NULL), vValues = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
        }
        if ( vIndex1 == NULL || vIndex2 == NULL || vValues == NULL )
            { printf( "Incomplete table specification\n" ); return 0; }
        // dump the table
        vInd1 = vIndex1;
        vInd2 = vIndex2;
        // write entries
        Vec_StrPutI_( vOut, Vec_FltSize(vInd1) );
        Vec_FltForEachEntry( vInd1, Entry, i )
            Vec_StrPutF_( vOut, Entry );
        Vec_StrPut_( vOut );
        // write entries
        Vec_StrPutI_( vOut, Vec_FltSize(vInd2) );
        Vec_FltForEachEntry( vInd2, Entry, i )
            Vec_StrPutF_( vOut, Entry );
        Vec_StrPut_( vOut );
        Vec_StrPut_( vOut );
        // write entries
        assert( Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues) );
        Vec_FltForEachEntry( vValues, Entry, i )
        {
            Vec_StrPutF_( vOut, Entry );
            if ( i % Vec_FltSize(vInd2) == Vec_FltSize(vInd2)-1 )
                Vec_StrPut_( vOut );
        }
    }
    else
    {
        // fetch the template
        iPlace = -1;
        Vec_PtrForEachEntry( char *, vTemples, pThis, i )
            if ( i % 4 == 0 && !strcmp(pTempl, pThis) )
            {  
                iPlace = i;
                break;
            }
        if ( iPlace == -1 )
            { printf( "Template cannot be found in the template library\n" ); return 0; }
        // read the numbers
        Scl_ItemForEachChild( p, pTable, pItem )
        {
            if ( !Scl_LibertyCompare(p, pItem->Key, "index_1") )
                assert(vIndex1 == NULL), vIndex1 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "index_2") )
                assert(vIndex2 == NULL), vIndex2 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "values") )
                assert(vValues == NULL), vValues = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
        }
        // check the template style
        vInd1 = (Vec_Flt_t *)Vec_PtrEntry( vTemples, iPlace + 2 ); // slew
        vInd2 = (Vec_Flt_t *)Vec_PtrEntry( vTemples, iPlace + 3 ); // load
        if ( Vec_PtrEntry(vTemples, iPlace + 1) == NULL ) // normal order (vIndex1 is slew; vIndex2 is load)
        {
            assert( !vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd1) );
            assert( !vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd2) );
            vInd1 = vIndex1 ? vIndex1 : vInd1;
            vInd2 = vIndex2 ? vIndex2 : vInd2;
            // write entries
            Vec_StrPutI_( vOut, Vec_FltSize(vInd1) );
            Vec_FltForEachEntry( vInd1, Entry, i )
                Vec_StrPutF_( vOut, Entry );
            Vec_StrPut_( vOut );
            // write entries
            Vec_StrPutI_( vOut, Vec_FltSize(vInd2) );
            Vec_FltForEachEntry( vInd2, Entry, i )
                Vec_StrPutF_( vOut, Entry );
            Vec_StrPut_( vOut );
            Vec_StrPut_( vOut );
            // write entries
            assert( Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues) );
            Vec_FltForEachEntry( vValues, Entry, i )
            {
                Vec_StrPutF_( vOut, Entry );
                if ( i % Vec_FltSize(vInd2) == Vec_FltSize(vInd2)-1 )
                    Vec_StrPut_( vOut );
            }
        }
        else  // reverse order (vIndex2 is slew; vIndex1 is load)
        {
            assert( !vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd1) );
            assert( !vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd2) );
            vInd1 = vIndex2 ? vIndex2 : vInd1;
            vInd2 = vIndex1 ? vIndex1 : vInd2;
            // write entries
            Vec_StrPutI_( vOut, Vec_FltSize(vInd1) );
            Vec_FltForEachEntry( vInd1, Entry, i )
                Vec_StrPutF_( vOut, Entry );
            Vec_StrPut_( vOut );
            // write entries
            Vec_StrPutI_( vOut, Vec_FltSize(vInd2) );
            Vec_FltForEachEntry( vInd2, Entry, i )
                Vec_StrPutF_( vOut, Entry );
            Vec_StrPut_( vOut );
            Vec_StrPut_( vOut );
            // write entries -- transpose
            assert( Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues) );
            Vec_FltForEachEntry( vValues, Entry, i )
            {
                int x = i % Vec_FltSize(vInd2);
                int y = i / Vec_FltSize(vInd2);
                Entry = Vec_FltEntry( vValues, x * Vec_FltSize(vInd1) + y );
                Vec_StrPutF_( vOut, Entry );
                if ( i % Vec_FltSize(vInd2) == Vec_FltSize(vInd2)-1 )
                    Vec_StrPut_( vOut );
            }
        }
    }
    Vec_StrPut_( vOut );
    for ( i = 0; i < 3; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    for ( i = 0; i < 4; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    for ( i = 0; i < 6; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    Vec_FltFreeP( &vIndex1 );
    Vec_FltFreeP( &vIndex2 );
    Vec_FltFreeP( &vValues );
    Vec_StrPut_( vOut );
    Vec_StrPut_( vOut );
    return 1;
}